

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpringConstraint.h
# Opt level: O2

char * __thiscall
btGeneric6DofSpringConstraint::serialize
          (btGeneric6DofSpringConstraint *this,void *dataBuffer,btSerializer *serializer)

{
  long lVar1;
  
  btGeneric6DofConstraint::serialize(&this->super_btGeneric6DofConstraint,dataBuffer,serializer);
  for (lVar1 = -6; lVar1 != 0; lVar1 = lVar1 + 1) {
    *(btScalar *)((long)dataBuffer + lVar1 * 4 + 0x138) = this->m_springStiffness[lVar1];
    *(btScalar *)((long)dataBuffer + lVar1 * 4 + 0x168) = this->m_springDamping[lVar1 + 6];
    *(uint *)((long)dataBuffer + lVar1 * 4 + 0x120) =
         (uint)*(byte *)((long)this->m_equilibriumPoint + lVar1 + -1);
    *(btScalar *)((long)dataBuffer + lVar1 * 4 + 0x150) = this->m_springDamping[lVar1];
  }
  return "btGeneric6DofSpringConstraintData";
}

Assistant:

SIMD_FORCE_INLINE	const char*	btGeneric6DofSpringConstraint::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btGeneric6DofSpringConstraintData2* dof = (btGeneric6DofSpringConstraintData2*)dataBuffer;
	btGeneric6DofConstraint::serialize(&dof->m_6dofData,serializer);

	int i;
	for (i=0;i<6;i++)
	{
		dof->m_equilibriumPoint[i] = m_equilibriumPoint[i];
		dof->m_springDamping[i] = m_springDamping[i];
		dof->m_springEnabled[i] = m_springEnabled[i]? 1 : 0;
		dof->m_springStiffness[i] = m_springStiffness[i];
	}
	return btGeneric6DofSpringConstraintDataName;
}